

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalGraph.cpp
# Opt level: O2

SetInfluences * __thiscall
wasm::LocalGraphFlower::getSetInfluencesGivenObstacle
          (SetInfluences *__return_storage_ptr__,LocalGraphFlower *this,LocalSet *set,
          SetInfluences *gets,Expression *obstacle)

{
  uint uVar1;
  LocalSet *pLVar2;
  pointer ppFVar3;
  bool bVar4;
  mapped_type *pmVar5;
  FlowBlock *pFVar6;
  ulong uVar7;
  pointer ppFVar8;
  bool bVar9;
  pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int> item;
  pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int> pVar10;
  undefined1 local_110 [8];
  UniqueNonrepeatingDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
  work;
  key_type local_40;
  LocalGet *get;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  work.processed._M_h._M_single_bucket = &(gets->_M_h)._M_before_begin;
  get = (LocalGet *)__return_storage_ptr__;
LAB_008f9a79:
  do {
    work.processed._M_h._M_single_bucket = (work.processed._M_h._M_single_bucket)->_M_nxt;
    if (work.processed._M_h._M_single_bucket == (_Hash_node_base *)0x0) {
      return (SetInfluences *)get;
    }
    local_40 = (key_type)work.processed._M_h._M_single_bucket[1]._M_nxt;
    pmVar5 = std::__detail::
             _Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->getLocations,&local_40);
    pFVar6 = pmVar5->first;
  } while (pFVar6 == (FlowBlock *)0x0);
  uVar1 = pmVar5->second;
  UniqueNonrepeatingDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>::
  UniqueNonrepeatingDeferredQueue
            ((UniqueNonrepeatingDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
              *)local_110);
  pVar10.second = uVar1;
  pVar10.first = pFVar6;
  pVar10._12_4_ = 0;
  UniqueNonrepeatingDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>::
  push((UniqueNonrepeatingDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
        *)local_110,pVar10);
LAB_008f9ac4:
  bVar9 = false;
  do {
    bVar4 = UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>::
            empty((UniqueDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
                   *)local_110);
    if (bVar4 || bVar9) {
      UniqueNonrepeatingDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
      ::~UniqueNonrepeatingDeferredQueue
                ((UniqueNonrepeatingDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
                  *)local_110);
      goto LAB_008f9a79;
    }
    pVar10 = UniqueNonrepeatingDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
             ::pop((UniqueNonrepeatingDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
                    *)local_110);
    pFVar6 = pVar10.first;
    uVar7 = pVar10._8_8_ & 0xffffffff;
LAB_008f9ade:
    bVar9 = uVar7 == 0;
    uVar7 = uVar7 - 1;
    if (bVar9) break;
    pLVar2 = (LocalSet *)
             (pFVar6->actions).
             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
             super__Vector_impl_data._M_start[uVar7];
    if ((pLVar2->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id !=
        LocalSetId) {
      if (pLVar2 == (LocalSet *)obstacle) goto LAB_008f9ac4;
      goto LAB_008f9ade;
    }
    if (pLVar2 != set) {
      if (pLVar2->index == set->index) goto LAB_008f9ac4;
      goto LAB_008f9ade;
    }
    bVar9 = true;
    std::__detail::
    _Insert_base<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::insert((_Insert_base<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)get,&local_40);
  } while( true );
  ppFVar3 = (pFVar6->in).
            super__Vector_base<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar8 = (pFVar6->in).
                 super__Vector_base<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppFVar8 != ppFVar3;
      ppFVar8 = ppFVar8 + 1) {
    pFVar6 = *ppFVar8;
    item._8_8_ = (ulong)((long)(pFVar6->actions).
                               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pFVar6->actions).
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3;
    item.first = pFVar6;
    UniqueNonrepeatingDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>::
    push((UniqueNonrepeatingDeferredQueue<std::pair<wasm::LocalGraphFlower::FlowBlock_*,_unsigned_int>_>
          *)local_110,item);
  }
  goto LAB_008f9ac4;
}

Assistant:

LocalGraphBase::SetInfluences
  getSetInfluencesGivenObstacle(LocalSet* set,
                                const LocalGraphBase::SetInfluences& gets,
                                Expression* obstacle) {
    LocalGraphBase::SetInfluences ret;
    // Normally flowing backwards is faster, as we start from actual gets (and
    // so we avoid flowing past all the gets to large swaths of the program that
    // we don't care about; and in reverse, we might go all the way to the
    // entry in a wasteful manner, but most gets have an actual set, and do not
    // read the default value). The situation here is a bit different, though,
    // in that we might expect that going forward from the set would quickly
    // reach the obstacle and stop. Still, a single branch away would cause us
    // to scan lots of blocks potentially, and might not be that rare in
    // general, so go backwards. (Many uninteresting branches away, that reach
    // no relevant gets, are common when exceptions are enabled, as every call
    // gets a branch.)
    for (auto* get : gets) {
      auto [block, index] = getLocations[get];
      if (!block) {
        // We did not find location info for this get, which means it is
        // unreachable.
        continue;
      }

      // Use a work queue of block locations to scan backwards from.
      // Specifically we must scan the first index above it (i.e., the original
      // location has a local.get there, so we start one before it).
      UniqueNonrepeatingDeferredQueue<BlockLocation> work;
      work.push(BlockLocation{block, index});
      auto foundSet = false;
      // Flow while there is stuff to flow, and while we haven't found the set
      // (once we find it, we add the get and can move on to the next get).
      while (!work.empty() && !foundSet) {
        auto [block, index] = work.pop();

        // Scan backwards through this block.
        while (1) {
          // If we finished scanning this block (we reached the top), flow to
          // predecessors.
          if (index == 0) {
            for (auto* pred : block->in) {
              // We will scan pred from its very end.
              work.push(BlockLocation{pred, Index(pred->actions.size())});
            }
            break;
          }

          // Continue onwards.
          index--;
          auto* action = block->actions[index];
          if (auto* otherSet = action->dynCast<LocalSet>()) {
            if (otherSet == set) {
              // We arrived at the set: add this get and stop flowing it.
              ret.insert(get);
              foundSet = true;
              break;
            }
            if (otherSet->index == set->index) {
              // This is another set of the same index, which halts the flow.
              break;
            }
          } else if (action == obstacle) {
            // We ran into the obstacle. Halt this flow.
            break;
          }
          // TODO: If the action is one of the gets we are scanning, then
          // either we have processed it already, or will do so later, and we
          // can halt. As an optimization, we could check if we've processed
          // it already and act accordingly.
        }
      }
    }

    return ret;
  }